

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

Node __thiscall xt::vector::pushTail(vector *this,Vector *v,uint level,Node *parent,Node *tailnode)

{
  element_type *peVar1;
  _Node *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Object *this_01;
  long lVar3;
  ulong uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  _Node *__tmp;
  Object *o;
  element_type *peVar5;
  uint uVar6;
  Node NVar7;
  Node nodeToInsert;
  Object local_d8;
  element_type *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_b0 [2];
  Node local_a0;
  Node local_90;
  Node local_80;
  Vector local_70;
  vector *local_60;
  Vector *local_58;
  Object local_50;
  
  uVar6 = ((v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->cnt;
  local_58 = v;
  this_00 = (_Node *)operator_new(0x10);
  _Node::_Node(this_00);
  *(_Node **)this = this_00;
  local_60 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<xt::_Node*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_60,this_00);
  peVar1 = (((parent->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->array).
           super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  o = *(Object **)&(peVar1->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)._M_impl;
  lVar3 = (long)*(pointer *)
                 ((long)&(peVar1->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>).
                         _M_impl + 8) - (long)o >> 5;
  if (0 < lVar3) {
    this_01 = *(Object **)**(undefined8 **)this;
    uVar4 = lVar3 + 1;
    do {
      Object::operator=(this_01,o);
      o = o + 1;
      this_01 = this_01 + 1;
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  uVar6 = uVar6 - 1 >> ((byte)level & 0x1f) & 0x1f;
  local_b8 = (element_type *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (level == 5) {
    local_b8 = (tailnode->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (a_Stack_b0,
               &(tailnode->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    this_02._M_pi = a_Stack_b0[0]._M_pi;
    peVar5 = local_b8;
  }
  else {
    Object::Object(&local_50,
                   (Object *)
                   ((ulong)(uVar6 << 5) +
                   *(long *)&(((((parent->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->array).
                               super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)
                             ._M_impl));
    if (local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 8) =
             *(_Atomic_word *)
              ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 8) + 1;
      }
    }
    if (local_50.field_2.raw == (void *)0x0) {
      local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (tailnode->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (tailnode->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      newPath((vector *)&local_d8,level - 5,&local_a0);
    }
    else {
      local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (local_58->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (local_58->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
      ;
      if (local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_80.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_50.field_2.number;
      local_80.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)
           ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 8) =
               *(_Atomic_word *)
                ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)
           ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 8) =
               *(_Atomic_word *)
                ((long)local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 8) + 1;
        }
      }
      local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (tailnode->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (tailnode->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pushTail((vector *)&local_d8,&local_70,level - 5,&local_80,&local_90);
    }
    _Var2._M_pi = a_Stack_b0[0]._M_pi;
    this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.typeinfo;
    peVar5 = (element_type *)local_d8._0_8_;
    local_d8._0_8_ = (element_type *)0x0;
    local_d8.typeinfo = (TypeInfo *)0x0;
    local_b8 = peVar5;
    a_Stack_b0[0]._M_pi = this_02._M_pi;
    if ((_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.typeinfo !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.typeinfo);
    }
    _Var2._M_pi = local_a0.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    if (local_50.field_2.raw != (void *)0x0) {
      if (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      _Var2._M_pi = local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi;
      if (local_80.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
        _Var2._M_pi = local_70.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
    }
    if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    if (local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_50.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (this_02._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_d8.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_d8.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)this_02._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
        UNLOCK();
        goto LAB_00107975;
      }
    }
    else {
      (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
    }
    (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
  }
LAB_00107975:
  local_d8.type = Pointer;
  local_d8.typeinfo = (TypeInfo *)_Node::type_info;
  local_d8.field_2.number = (double)peVar5;
  Object::operator=((Object *)((ulong)(uVar6 << 5) + *(long *)**(undefined8 **)this),&local_d8);
  _Var2._M_pi = extraout_RDX;
  if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  NVar7.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  NVar7.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Node)NVar7.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node pushTail(Vector v, unsigned int level, Node parent, Node tailnode) {
	unsigned int subidx = ((v->cnt -1) >> level) & 0x01f;
	Node ret = Node(new _Node);
	std::copy(parent->array->begin(), parent->array->end(), ret->array->begin());
	Node nodeToInsert;
	if (level == 5)
		nodeToInsert = tailnode;
	else {
		Node child = to_node((*parent->array)[subidx]);
		nodeToInsert = (child != nullptr) ? pushTail(v, level - 5, child, tailnode) : newPath(level - 5, tailnode);
	}
	(*ret->array)[subidx] = nodeToInsert;
	return ret;
}